

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_enum.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::javanano::EnumGenerator::Generate(EnumGenerator *this,Printer *printer)

{
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  string *psVar5;
  ulong uVar6;
  size_type sVar7;
  reference ppEVar8;
  char *pcVar9;
  reference pvVar10;
  int i_00;
  string local_128;
  string local_108;
  int local_e4;
  undefined1 local_e0 [4];
  int i_2;
  string local_c0;
  int local_a0;
  allocator local_99;
  int i_1;
  undefined1 local_78 [8];
  string constant_name;
  int i;
  bool use_shell_class;
  undefined1 local_38 [7];
  bool use_intdef;
  string classname;
  Printer *printer_local;
  EnumGenerator *this_local;
  
  classname.field_2._8_8_ = printer;
  psVar5 = EnumDescriptor::name_abi_cxx11_(this->descriptor_);
  io::Printer::Print(printer,"\n// enum $classname$\n","classname",psVar5);
  psVar5 = EnumDescriptor::name_abi_cxx11_(this->descriptor_);
  RenameJavaKeywords((string *)local_38,psVar5);
  bVar2 = Params::generate_intdefs(this->params_);
  bVar3 = Params::java_enum_style(this->params_);
  if (bVar2) {
    io::Printer::Print((Printer *)classname.field_2._8_8_,
                       "@java.lang.annotation.Retention(java.lang.annotation.RetentionPolicy.SOURCE)\n@android.support.annotation.IntDef({\n"
                      );
    io::Printer::Indent((Printer *)classname.field_2._8_8_);
    for (constant_name.field_2._12_4_ = 0; uVar6 = (ulong)(int)constant_name.field_2._12_4_,
        sVar7 = std::
                vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                ::size(&this->canonical_values_), uVar6 < sVar7;
        constant_name.field_2._12_4_ = constant_name.field_2._12_4_ + 1) {
      ppEVar8 = std::
                vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                ::operator[](&this->canonical_values_,(long)(int)constant_name.field_2._12_4_);
      psVar5 = EnumValueDescriptor::name_abi_cxx11_(*ppEVar8);
      RenameJavaKeywords((string *)local_78,psVar5);
      if (bVar3) {
        io::Printer::Print((Printer *)classname.field_2._8_8_,"$classname$.$name$,\n","classname",
                           (string *)local_38,"name",(string *)local_78);
      }
      else {
        io::Printer::Print((Printer *)classname.field_2._8_8_,"$name$,\n","name",(string *)local_78)
        ;
      }
      std::__cxx11::string::~string((string *)local_78);
    }
    io::Printer::Outdent((Printer *)classname.field_2._8_8_);
    io::Printer::Print((Printer *)classname.field_2._8_8_,"})\n");
  }
  uVar1 = classname.field_2._8_8_;
  if ((bVar3) || (bVar2)) {
    pcVar9 = "";
    if (bVar2) {
      pcVar9 = "@";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&i_1,pcVar9,&local_99);
    io::Printer::Print((Printer *)uVar1,"public $at_for_intdef$interface $classname$ {\n",
                       "classname",(string *)local_38,"at_for_intdef",(string *)&i_1);
    std::__cxx11::string::~string((string *)&i_1);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    if (bVar3) {
      io::Printer::Indent((Printer *)classname.field_2._8_8_);
    }
    else {
      io::Printer::Print((Printer *)classname.field_2._8_8_,"}\n\n");
    }
  }
  for (local_a0 = 0; uVar6 = (ulong)local_a0,
      sVar7 = std::
              vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
              ::size(&this->canonical_values_), uVar1 = classname.field_2._8_8_, uVar6 < sVar7;
      local_a0 = local_a0 + 1) {
    ppEVar8 = std::
              vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
              ::operator[](&this->canonical_values_,(long)local_a0);
    psVar5 = EnumValueDescriptor::name_abi_cxx11_(*ppEVar8);
    RenameJavaKeywords(&local_c0,psVar5);
    ppEVar8 = std::
              vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
              ::operator[](&this->canonical_values_,(long)local_a0);
    uVar4 = EnumValueDescriptor::number(*ppEVar8);
    SimpleItoa_abi_cxx11_((string *)local_e0,(protobuf *)(ulong)uVar4,i_00);
    io::Printer::Print((Printer *)uVar1,"public static final int $name$ = $canonical_value$;\n",
                       "name",&local_c0,"canonical_value",(string *)local_e0);
    std::__cxx11::string::~string((string *)local_e0);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  for (local_e4 = 0; uVar6 = (ulong)local_e4,
      sVar7 = std::
              vector<google::protobuf::compiler::javanano::EnumGenerator::Alias,_std::allocator<google::protobuf::compiler::javanano::EnumGenerator::Alias>_>
              ::size(&this->aliases_), uVar1 = classname.field_2._8_8_, uVar6 < sVar7;
      local_e4 = local_e4 + 1) {
    pvVar10 = std::
              vector<google::protobuf::compiler::javanano::EnumGenerator::Alias,_std::allocator<google::protobuf::compiler::javanano::EnumGenerator::Alias>_>
              ::operator[](&this->aliases_,(long)local_e4);
    psVar5 = EnumValueDescriptor::name_abi_cxx11_(pvVar10->value);
    RenameJavaKeywords(&local_108,psVar5);
    pvVar10 = std::
              vector<google::protobuf::compiler::javanano::EnumGenerator::Alias,_std::allocator<google::protobuf::compiler::javanano::EnumGenerator::Alias>_>
              ::operator[](&this->aliases_,(long)local_e4);
    psVar5 = EnumValueDescriptor::name_abi_cxx11_(pvVar10->canonical_value);
    RenameJavaKeywords(&local_128,psVar5);
    io::Printer::Print((Printer *)uVar1,"public static final int $name$ = $canonical_name$;\n",
                       "name",&local_108,"canonical_name",&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_108);
  }
  if (bVar3) {
    io::Printer::Outdent((Printer *)classname.field_2._8_8_);
    io::Printer::Print((Printer *)classname.field_2._8_8_,"}\n");
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void EnumGenerator::Generate(io::Printer* printer) {
  printer->Print(
      "\n"
      "// enum $classname$\n",
      "classname", descriptor_->name());

  const string classname = RenameJavaKeywords(descriptor_->name());

  // Start of container interface
  // If generating intdefs, we use the container interface as the intdef if
  // present. Otherwise, we just make an empty @interface parallel to the
  // constants.
  bool use_intdef = params_.generate_intdefs();
  bool use_shell_class = params_.java_enum_style();
  if (use_intdef) {
    // @IntDef annotation so tools can enforce correctness
    // Annotations will be discarded by the compiler
    printer->Print("@java.lang.annotation.Retention("
      "java.lang.annotation.RetentionPolicy.SOURCE)\n"
      "@android.support.annotation.IntDef({\n");
    printer->Indent();
    for (int i = 0; i < canonical_values_.size(); i++) {
      const string constant_name =
          RenameJavaKeywords(canonical_values_[i]->name());
      if (use_shell_class) {
        printer->Print("$classname$.$name$,\n",
          "classname", classname,
          "name", constant_name);
      } else {
        printer->Print("$name$,\n", "name", constant_name);
      }
    }
    printer->Outdent();
    printer->Print("})\n");
  }
  if (use_shell_class || use_intdef) {
    printer->Print(
      "public $at_for_intdef$interface $classname$ {\n",
      "classname", classname,
      "at_for_intdef", use_intdef ? "@" : "");
    if (use_shell_class) {
        printer->Indent();
    } else {
        printer->Print("}\n\n");
    }
  }

  // Canonical values
  for (int i = 0; i < canonical_values_.size(); i++) {
    printer->Print(
      "public static final int $name$ = $canonical_value$;\n",
      "name", RenameJavaKeywords(canonical_values_[i]->name()),
      "canonical_value", SimpleItoa(canonical_values_[i]->number()));
  }

  // Aliases
  for (int i = 0; i < aliases_.size(); i++) {
    printer->Print(
      "public static final int $name$ = $canonical_name$;\n",
      "name", RenameJavaKeywords(aliases_[i].value->name()),
      "canonical_name", RenameJavaKeywords(aliases_[i].canonical_value->name()));
  }

  // End of container interface
  if (use_shell_class) {
    printer->Outdent();
    printer->Print("}\n");
  }
}